

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_jz_ecx(DisasContext *s,MemOp size,TCGLabel *label1)

{
  TCGContext *tcg_ctx;
  uintptr_t o_1;
  TCGv_i64 dst;
  
  dst = s->tmp0;
  tcg_ctx = s->uc->tcg_ctx;
  if (dst != tcg_ctx->cpu_regs[1]) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(dst + (long)tcg_ctx),
                       (TCGArg)(tcg_ctx->cpu_regs[1] + (long)tcg_ctx));
    dst = s->tmp0;
  }
  gen_ext_tl(tcg_ctx,dst,dst,size,false);
  tcg_gen_brcondi_i64_x86_64(tcg_ctx,TCG_COND_EQ,s->tmp0,0,label1);
  return;
}

Assistant:

static inline
void gen_op_jz_ecx(DisasContext *s, MemOp size, TCGLabel *label1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_regs[R_ECX]);
    gen_extu(tcg_ctx, size, s->tmp0);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, s->tmp0, 0, label1);
}